

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O2

uint UF::MemMerge(uint i,uint j)

{
  int iVar1;
  pointer puVar2;
  pointer piVar3;
  
  piVar3 = mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    iVar1 = piVar3[(int)i];
    piVar3[(int)i] = iVar1 + 1;
    if (i <= puVar2[(int)i]) break;
    piVar3[(int)i] = iVar1 + 2;
    i = puVar2[(int)i];
  }
  while( true ) {
    iVar1 = piVar3[(int)j];
    piVar3[(int)j] = iVar1 + 1;
    if (j <= puVar2[(int)j]) break;
    piVar3[(int)j] = iVar1 + 2;
    j = puVar2[(int)j];
  }
  if (i < j) {
    piVar3[(int)j] = iVar1 + 2;
    puVar2[(int)j] = i;
    return i;
  }
  piVar3[(int)i] = piVar3[(int)i] + 1;
  puVar2[(int)i] = j;
  return j;
}

Assistant:

static unsigned MemMerge(unsigned i, unsigned j)
    {
        // FindRoot(i)
        while (mem_P_[i] < i) {
            i = mem_P_[i];
        }

        // FindRoot(j)
        while (mem_P_[j] < j) {
            j = mem_P_[j];
        }

        if (i < j)
            return mem_P_[j] = i;
        return mem_P_[i] = j;
    }